

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infback.c
# Opt level: O3

int32_t zng_inflateBackEnd(zng_stream *strm)

{
  int32_t iVar1;
  
  iVar1 = -2;
  if (((strm != (zng_stream *)0x0) && (strm->state != (internal_state *)0x0)) &&
     (strm->zfree != (free_func)0x0)) {
    free_inflate(strm);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateBackEnd)(PREFIX3(stream) *strm) {
    if (strm == NULL || strm->state == NULL || strm->zfree == NULL)
        return Z_STREAM_ERROR;

    /* Free allocated buffers */
    free_inflate(strm);

    Tracev((stderr, "inflate: end\n"));
    return Z_OK;
}